

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.h
# Opt level: O2

void __thiscall
wallet::PreSelectedInputs::Insert(PreSelectedInputs *this,COutput *output,bool subtract_fee_outputs)

{
  long lVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  _Storage<long,_true> local_20;
  
  local_20 = (_Storage<long,_true>)((_Storage<long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  if ((int)CONCAT71(in_register_00000011,subtract_fee_outputs) == 0) {
    lVar1 = COutput::GetEffectiveValue(output);
  }
  else {
    lVar1 = (output->txout).nValue;
  }
  this->total_amount = this->total_amount + lVar1;
  std::make_shared<wallet::COutput,wallet::COutput_const&>((COutput *)local_30);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
  ::_M_insert_unique<std::shared_ptr<wallet::COutput>>
            ((_Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
              *)this,(shared_ptr<wallet::COutput> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20._M_value) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Insert(const COutput& output, bool subtract_fee_outputs)
    {
        if (subtract_fee_outputs) {
            total_amount += output.txout.nValue;
        } else {
            total_amount += output.GetEffectiveValue();
        }
        coins.insert(std::make_shared<COutput>(output));
    }